

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int __thiscall
CVmObjFile::get_prop
          (CVmObjFile *this,vm_prop_id_t prop,vm_val_t *retval,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  CVmMetaTable *pCVar1;
  uint uVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  vm_obj_id_t in_ECX;
  long *plVar5;
  vm_val_t *in_RDX;
  vm_prop_id_t in_SI;
  CVmMetaTable *in_RDI;
  vm_obj_id_t *in_R8;
  uint *in_R9;
  uint func_idx;
  CVmMetaclass *local_68;
  CVmMetaclass *this_00;
  CVmMetaTable *this_01;
  int local_4;
  
  pCVar1 = G_meta_table_X;
  this_01 = in_RDI;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  uVar2 = CVmMetaTable::prop_to_vector_idx
                    (in_RDI,(uint)((ulong)pCVar1 >> 0x20),(vm_prop_id_t)((ulong)pCVar1 >> 0x10));
  this_00 = (CVmMetaclass *)func_table_[(ulong)uVar2 * 2];
  plVar5 = (long *)((long)&in_RDI->table_ + func_table_[(ulong)uVar2 * 2 + 1]);
  local_68 = this_00;
  if (((ulong)this_00 & 1) != 0) {
    local_68 = *(CVmMetaclass **)((long)this_00 + *plVar5 + -1);
  }
  iVar3 = (*(code *)local_68)(plVar5,in_ECX,in_RDX,in_R9);
  if (iVar3 == 0) {
    local_4 = CVmObject::get_prop((CVmObject *)this_01,in_SI,in_RDX,in_ECX,in_R8,in_R9);
  }
  else {
    vVar4 = CVmMetaclass::get_class_obj(this_00);
    *in_R8 = vVar4;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmObjFile::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *retval,
                            vm_obj_id_t self, vm_obj_id_t *source_obj,
                            uint *argc)
{
    uint func_idx;

    /* translate the property index to an index into our function table */
    func_idx = G_meta_table
               ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop);

    /* call the appropriate function */
    if ((this->*func_table_[func_idx])(vmg_ self, retval, argc))
    {
        *source_obj = metaclass_reg_->get_class_obj(vmg0_);
        return TRUE;
    }

    /* inherit default handling */
    return CVmObject::get_prop(vmg_ prop, retval, self, source_obj, argc);
}